

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanBlockScalar(Scanner *this,bool IsLiteral)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  char *in_start;
  uint uVar4;
  undefined1 local_1c0 [8];
  SmallString<256U> Str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined8 local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  StringRef local_58;
  iterator local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  char local_32;
  bool local_31;
  uint BlockIndent;
  char ChompingIndicator;
  bool IsDone;
  
  if ((*this->Current != '>') && (*this->Current != '|')) {
    __assert_fail("*Current == \'|\' || *Current == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLParser.cpp"
                  ,0x5f5,"bool llvm::yaml::Scanner::scanBlockScalar(bool)");
  }
  skip(this,1);
  local_31 = false;
  bVar1 = scanBlockScalarHeader(this,&local_32,&local_38,&local_31);
  if (bVar1) {
    if (local_31 != false) {
      return true;
    }
    uVar2 = this->Indent;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    local_48 = this->Current;
    local_40 = 0;
    local_3c = local_38;
    if (local_38 == 0) {
      bVar1 = findBlockScalarIndent(this,&local_38,uVar2,&local_40,&local_31);
      if (!bVar1) goto LAB_00dc95e2;
      local_3c = local_38;
    }
    local_1c0 = (undefined1  [8])
                &Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = (void *)0x10000000000;
    bVar3 = local_31;
    uVar4 = local_40;
    while ((bVar3 & 1) == 0) {
      bVar1 = scanBlockScalarIndent(this,local_3c,uVar2,&local_31);
      if (!bVar1) {
        bVar1 = false;
        goto LAB_00dc96c9;
      }
      if (local_31 != false) break;
      in_start = this->Current;
      advanceWhile(this,(SkipWhileFunc)skip_nb_char);
      if (in_start != this->Current) {
        SmallString<256U>::append((SmallString<256U> *)local_1c0,(ulong)uVar4,'\n');
        SmallVectorImpl<char>::append<char_const*,void>
                  ((SmallVectorImpl<char> *)local_1c0,in_start,this->Current);
        in_start = this->Current;
        uVar4 = 0;
      }
      if ((in_start == this->End) || (bVar1 = consumeLineBreakIfPresent(this), !bVar1)) break;
      uVar4 = uVar4 + 1;
      bVar3 = 0;
    }
    if (local_32 == '-') {
      uVar2 = 0;
    }
    else if (local_32 == '+') {
      uVar2 = 1;
      if (uVar4 != 0) {
        uVar2 = uVar4;
      }
      if (this->Current != this->End) {
        uVar2 = uVar4;
      }
    }
    else {
      uVar2 = (uint)((int)Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                          super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                    != 0);
    }
    SmallString<256U>::append((SmallString<256U> *)local_1c0,(ulong)uVar2,'\n');
    if (this->FlowLevel == 0) {
      this->IsSimpleKeyAllowed = true;
    }
    local_98 = &local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf8].buffer
    [0] = (char  [1])0x13;
    Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xf9].buffer
    [0] = (char  [1])0x0;
    Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfa].buffer
    [0] = (char  [1])0x0;
    Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfb].buffer
    [0] = (char  [1])0x0;
    local_58.Length =
         (ulong)Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
         0xffffffff;
    local_58.Data = (char *)local_1c0;
    StringRef::str_abi_cxx11_(&local_78,&local_58);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,
                (Token *)(Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                          InlineElts + 0xf8));
    std::__cxx11::string::~string((string *)&local_98);
    bVar1 = true;
LAB_00dc96c9:
    SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_1c0);
  }
  else {
LAB_00dc95e2:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Scanner::scanBlockScalar(bool IsLiteral) {
  // Eat '|' or '>'
  assert(*Current == '|' || *Current == '>');
  skip(1);

  char ChompingIndicator;
  unsigned BlockIndent;
  bool IsDone = false;
  if (!scanBlockScalarHeader(ChompingIndicator, BlockIndent, IsDone))
    return false;
  if (IsDone)
    return true;

  auto Start = Current;
  unsigned BlockExitIndent = Indent < 0 ? 0 : (unsigned)Indent;
  unsigned LineBreaks = 0;
  if (BlockIndent == 0) {
    if (!findBlockScalarIndent(BlockIndent, BlockExitIndent, LineBreaks,
                               IsDone))
      return false;
  }

  // Scan the block's scalars body.
  SmallString<256> Str;
  while (!IsDone) {
    if (!scanBlockScalarIndent(BlockIndent, BlockExitIndent, IsDone))
      return false;
    if (IsDone)
      break;

    // Parse the current line.
    auto LineStart = Current;
    advanceWhile(&Scanner::skip_nb_char);
    if (LineStart != Current) {
      Str.append(LineBreaks, '\n');
      Str.append(StringRef(LineStart, Current - LineStart));
      LineBreaks = 0;
    }

    // Check for EOF.
    if (Current == End)
      break;

    if (!consumeLineBreakIfPresent())
      break;
    ++LineBreaks;
  }

  if (Current == End && !LineBreaks)
    // Ensure that there is at least one line break before the end of file.
    LineBreaks = 1;
  Str.append(getChompedLineBreaks(ChompingIndicator, LineBreaks, Str), '\n');

  // New lines may start a simple key.
  if (!FlowLevel)
    IsSimpleKeyAllowed = true;

  Token T;
  T.Kind = Token::TK_BlockScalar;
  T.Range = StringRef(Start, Current - Start);
  T.Value = Str.str().str();
  TokenQueue.push_back(T);
  return true;
}